

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS
ref_interp_convergence_rate
          (REF_DBL f3,REF_DBL h3,REF_DBL f2,REF_DBL h2,REF_DBL f1,REF_DBL h1,REF_DBL *rate)

{
  int iVar1;
  double __x;
  double __y;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double __x_00;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double __x_01;
  double dVar9;
  
  *rate = -1.0;
  auVar7._0_8_ = f2 - f3;
  auVar7._8_8_ = f1 - f2;
  auVar8._8_8_ = -auVar7._8_8_;
  auVar8._0_8_ = -auVar7._0_8_;
  auVar8 = maxpd(auVar7,auVar8);
  __x_01 = h2 / h1;
  dVar6 = auVar8._0_8_;
  __x = dVar6 / auVar8._8_8_;
  __y = log(__x);
  dVar9 = auVar8._8_8_ * 1e+20;
  if (dVar9 <= -dVar9) {
    dVar9 = -dVar9;
  }
  if (dVar6 <= -dVar6) {
    dVar6 = -dVar6;
  }
  iVar1 = 0x15;
  do {
    iVar1 = iVar1 + -1;
    dVar2 = __y;
    if (iVar1 == 0) break;
    if (dVar9 <= dVar6) {
      return 0;
    }
    dVar2 = pow(__x_01,__y);
    dVar3 = pow(h3 / h2,__y);
    __x_00 = ((dVar2 + -1.0) / (dVar3 + -1.0)) * __x;
    dVar2 = log(__x_01);
    dVar3 = log(__x_01);
    dVar2 = *(double *)(&DAT_002160b0 + (ulong)(0.0 < dVar2 * 1e+20) * 8);
    dVar4 = log(__x_00);
    dVar5 = log(__x_00);
    if (dVar3 * dVar2 <=
        (double)(~-(ulong)(0.0 < dVar4) & (ulong)-dVar5 | -(ulong)(0.0 < dVar4) & (ulong)dVar5)) {
      return 0;
    }
    dVar2 = log(__x_00);
    dVar3 = log(__x_01);
    dVar2 = __y * 0.5 + (dVar2 * 0.5) / dVar3;
    dVar3 = dVar2 - __y;
    if (dVar3 <= -dVar3) {
      dVar3 = -dVar3;
    }
    __y = dVar2;
  } while (0.0001 <= dVar3);
  *rate = dVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_interp_convergence_rate(REF_DBL f3, REF_DBL h3,
                                               REF_DBL f2, REF_DBL h2,
                                               REF_DBL f1, REF_DBL h1,
                                               REF_DBL *rate) {
  REF_DBL e12, e23, r12, r23;
  REF_DBL beta, omega = 0.5;
  REF_DBL p, last_p;
  REF_INT i;
  /*   AIAA JOURNAL Vol. 36, No. 5, May 1998
       Verification of Codes and Calculations
       Patrick J. Roache */
  /*
  f3 = a coarse grid numerical solution obtained with grid spacing h3
  f2 = a medium grid numerical solution obtained with grid spacing h2
  f1 = a fine grid numerical solution obtained with grid spacing h1
  */
  *rate = -1.0;
  e12 = ABS(f1 - f2);
  e23 = ABS(f2 - f3);
  r12 = h2 / h1;
  r23 = h3 / h2;
  p = log(e23 / e12);
  for (i = 0; i < 20; i++) {
    last_p = p;
    if (!ref_math_divisible(e23, e12)) return REF_SUCCESS;
    beta = ((pow(r12, p) - 1.0) / (pow(r23, p) - 1.0)) * (e23 / e12);
    if (!ref_math_divisible(log(beta), log(r12))) return REF_SUCCESS;
    p = omega * p + (1.0 - omega) * log(beta) / log(r12);
    if (ABS(p - last_p) < 0.0001) break;
  }
  *rate = p;
  return REF_SUCCESS;
}